

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O0

int picnic_read_public_key(picnic_publickey_t *key,uint8_t *buf,size_t buflen)

{
  uint diff_00;
  int iVar1;
  picnic_instance_t *ppVar2;
  ulong __n;
  ulong in_RDX;
  byte *in_RSI;
  void *in_RDI;
  uint diff;
  size_t bytes_required;
  picnic_instance_t *instance;
  picnic_params_t param;
  int local_4;
  
  if (((in_RDI == (void *)0x0) || (in_RSI == (byte *)0x0)) || (in_RDX == 0)) {
    local_4 = -1;
  }
  else {
    ppVar2 = picnic_instance_get((uint)*in_RSI);
    if (ppVar2 == (picnic_instance_t *)0x0) {
      local_4 = -1;
    }
    else {
      __n = (ulong)(int)((uint)ppVar2->input_output_size * 2 + 1);
      if (in_RDX < __n) {
        local_4 = -1;
      }
      else {
        if (((ppVar2->lowmc).n & 7) != 0) {
          diff_00 = (uint)ppVar2->input_output_size * 8 - (uint)(ppVar2->lowmc).n;
          iVar1 = check_padding_bits(in_RSI[(int)(uint)ppVar2->input_output_size],diff_00);
          if ((iVar1 != 0) ||
             (iVar1 = check_padding_bits(in_RSI[(int)((uint)ppVar2->input_output_size * 2)],diff_00)
             , iVar1 != 0)) {
            return -1;
          }
        }
        memcpy(in_RDI,in_RSI,__n);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_read_public_key(picnic_publickey_t* key, const uint8_t* buf,
                                                     size_t buflen) {
  if (!key || !buf || buflen < 1) {
    return -1;
  }

  const picnic_params_t param       = buf[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const size_t bytes_required = 1 + 2 * instance->input_output_size;
  if (buflen < bytes_required) {
    return -1;
  }

#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_255_255_4)
  if (instance->lowmc.n & 0x7) {
    const unsigned int diff = instance->input_output_size * 8 - instance->lowmc.n;
    if (check_padding_bits(buf[1 + instance->input_output_size - 1], diff) ||
        check_padding_bits(buf[1 + 2 * instance->input_output_size - 1], diff)) {
      return -1;
    }
  }
#endif

  memcpy(key->data, buf, bytes_required);
  return 0;
}